

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

LogLevel phosg::enum_for_name<phosg::LogLevel>(char *name)

{
  int iVar1;
  invalid_argument *this;
  char *name_local;
  
  iVar1 = strcmp(name,"USE_DEFAULT");
  if (iVar1 == 0) {
    name_local._4_4_ = USE_DEFAULT;
  }
  else {
    iVar1 = strcmp(name,"DEBUG");
    if (iVar1 == 0) {
      name_local._4_4_ = DEBUG;
    }
    else {
      iVar1 = strcmp(name,"INFO");
      if (iVar1 == 0) {
        name_local._4_4_ = INFO;
      }
      else {
        iVar1 = strcmp(name,"WARNING");
        if (iVar1 == 0) {
          name_local._4_4_ = WARNING;
        }
        else {
          iVar1 = strcmp(name,"ERROR");
          if (iVar1 == 0) {
            name_local._4_4_ = ERROR;
          }
          else {
            iVar1 = strcmp(name,"DISABLED");
            if (iVar1 != 0) {
              this = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::invalid_argument::invalid_argument(this,"invalid LogLevel name");
              __cxa_throw(this,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            name_local._4_4_ = DISABLED;
          }
        }
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

LogLevel enum_for_name<LogLevel>(const char* name) {
  if (!strcmp(name, "USE_DEFAULT")) {
    return LogLevel::USE_DEFAULT;
  } else if (!strcmp(name, "DEBUG")) {
    return LogLevel::DEBUG;
  } else if (!strcmp(name, "INFO")) {
    return LogLevel::INFO;
  } else if (!strcmp(name, "WARNING")) {
    return LogLevel::WARNING;
  } else if (!strcmp(name, "ERROR")) {
    return LogLevel::ERROR;
  } else if (!strcmp(name, "DISABLED")) {
    return LogLevel::DISABLED;
  } else {
    throw invalid_argument("invalid LogLevel name");
  }
}